

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::AtomNameVisitor::AtomNameVisitor(AtomNameVisitor *this,SimInfo *info)

{
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__BaseVisitor_00287f40;
  this->info_ = info;
  std::__cxx11::string::assign((char *)&(this->super_BaseVisitor).visitorName);
  this->ff_ = this->info_->forceField_;
  return;
}

Assistant:

AtomNameVisitor::AtomNameVisitor(SimInfo* info) : BaseVisitor(), info_(info) {
    visitorName = "AtomNameVisitor";
    ff_         = info_->getForceField();
  }